

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z3_16x4_avx2
               (uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  int iVar15;
  int iVar16;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int i_2;
  int i_1;
  __m128i d [8];
  __m128i dstvec [16];
  int i;
  int base_max_diff;
  int base;
  __m128i a1_128;
  __m128i a0_128;
  __m128i res1;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m256i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  __m128i *in_stack_fffffffffffff690;
  __m128i *in_stack_fffffffffffff698;
  int local_8f8;
  int local_8f4;
  undefined8 local_8f0 [8];
  longlong local_8b0 [6];
  longlong alStack_880 [2];
  undefined8 local_870 [12];
  longlong alStack_810 [22];
  long local_760;
  long local_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 *local_728;
  int local_71c;
  int local_718;
  int local_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  __m128i *local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [40];
  int local_678;
  uint local_674;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [32];
  __m128i *local_620;
  __m128i *palStack_618;
  __m128i *palStack_610;
  __m128i *palStack_608;
  undefined1 local_600 [16];
  __m128i *palStack_5f0;
  __m128i *palStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  int local_588;
  int local_584;
  byte local_57c;
  undefined8 *local_570;
  undefined4 local_568;
  undefined4 local_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  __m128i *in_stack_fffffffffffffab8;
  __m128i *in_stack_fffffffffffffac0;
  __m128i *in_stack_fffffffffffffac8;
  __m128i *in_stack_fffffffffffffad0;
  __m128i *in_stack_fffffffffffffad8;
  __m128i *in_stack_fffffffffffffae0;
  __m128i *in_stack_fffffffffffffae8;
  __m128i *in_stack_fffffffffffffaf0;
  __m128i *in_stack_fffffffffffffaf8;
  __m128i *in_stack_fffffffffffffb00;
  __m128i *in_stack_fffffffffffffb08;
  __m128i *in_stack_fffffffffffffb10;
  __m128i *in_stack_fffffffffffffb18;
  __m128i *in_stack_fffffffffffffb20;
  __m128i *in_stack_fffffffffffffb28;
  __m128i *in_stack_fffffffffffffb30;
  ushort in_stack_fffffffffffffb38;
  ushort in_stack_fffffffffffffb3a;
  undefined2 uVar20;
  undefined2 uVar21;
  __m128i *in_stack_fffffffffffffb40;
  __m128i *local_460;
  __m128i *palStack_458;
  __m128i *palStack_450;
  __m128i *palStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_a0;
  undefined8 uStack_98;
  
  local_564 = 4;
  local_568 = 0x10;
  local_57c = (byte)in_ECX;
  iVar14 = 0x13 << (local_57c & 0x1f);
  uVar21 = 0x10;
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar3 = vpinsrw_avx(auVar2,0x10,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar2 = vpinsrw_avx(auVar2,0x10,7);
  local_460 = auVar3._0_8_;
  palStack_458 = auVar3._8_8_;
  palStack_450 = auVar2._0_8_;
  palStack_448 = auVar2._8_8_;
  local_620 = local_460;
  palStack_618 = palStack_458;
  palStack_610 = palStack_450;
  palStack_608 = palStack_448;
  bVar1 = *(byte *)(in_RDX + iVar14);
  auVar2 = vpinsrb_avx(ZEXT116(bVar1),(uint)bVar1,1);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,2);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,3);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,4);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,5);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,6);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,7);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,8);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,9);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,10);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xb);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xc);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xd);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xe);
  auVar2 = vpinsrb_avx(auVar2,(uint)bVar1,0xf);
  local_a0 = auVar2._0_8_;
  uStack_98 = auVar2._8_8_;
  local_670 = local_a0;
  uStack_668 = uStack_98;
  uVar20 = 0x3f;
  auVar18 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar18 = vpinsrw_avx(auVar18,0x3f,2);
  auVar18 = vpinsrw_avx(auVar18,0x3f,3);
  auVar18 = vpinsrw_avx(auVar18,0x3f,4);
  auVar18 = vpinsrw_avx(auVar18,0x3f,5);
  auVar18 = vpinsrw_avx(auVar18,0x3f,6);
  auVar18 = vpinsrw_avx(auVar18,0x3f,7);
  auVar17 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar17 = vpinsrw_avx(auVar17,0x3f,2);
  auVar17 = vpinsrw_avx(auVar17,0x3f,3);
  auVar17 = vpinsrw_avx(auVar17,0x3f,4);
  auVar17 = vpinsrw_avx(auVar17,0x3f,5);
  auVar17 = vpinsrw_avx(auVar17,0x3f,6);
  auVar17 = vpinsrw_avx(auVar17,0x3f,7);
  auVar17 = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar17;
  auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
  uStack_410 = auVar18._0_8_;
  uStack_408 = auVar18._8_8_;
  local_678 = 0;
  auVar10 = local_6c0;
  auVar9 = local_6a0._0_32_;
  local_674 = in_R8D;
  auVar6 = _local_600;
  while( true ) {
    _local_600 = auVar6;
    local_6a0._0_32_ = auVar9;
    local_6c0 = auVar10;
    if (0xf < local_678) goto LAB_005d1e30;
    iVar15 = (int)local_674 >> ((byte)(6 - in_ECX) & 0x1f);
    iVar16 = iVar14 - iVar15 >> (local_57c & 0x1f);
    local_718 = iVar16;
    local_714 = iVar15;
    if (iVar16 < 1) break;
    if (4 < iVar16) {
      local_718 = 4;
    }
    local_700 = *(undefined1 (*) [16])(in_RDX + iVar15);
    local_710 = *(undefined1 (*) [16])(in_RDX + iVar15 + 1);
    if (in_ECX == 0) {
      auVar4 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,7);
      auVar19 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
      uStack_390 = auVar19._0_8_;
      uStack_388 = auVar19._8_8_;
      auVar6._16_8_ = uStack_390;
      auVar6._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
      auVar6._24_8_ = uStack_388;
      auVar10._16_8_ = uStack_410;
      auVar10._0_16_ = auVar17;
      auVar10._24_8_ = uStack_408;
      auVar10 = vpand_avx2(auVar6,auVar10);
      local_6e0 = vpsrlw_avx2(auVar10,ZEXT416(1));
      in_stack_fffffffffffffb38 = (ushort)local_674;
    }
    else {
      auVar4._8_8_ = EvenOddMaskx[0]._8_8_;
      auVar4._0_8_ = EvenOddMaskx[0]._0_8_;
      local_700 = vpshufb_avx(*(undefined1 (*) [16])(in_RDX + iVar15),auVar4);
      local_710 = vpsrldq_avx(local_700,8);
      auVar4 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,local_674 & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216((ushort)local_674),local_674 & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,local_674 & 0xffff,7);
      auVar19 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
      uStack_3d0 = auVar19._0_8_;
      uStack_3c8 = auVar19._8_8_;
      auVar7._16_8_ = uStack_3d0;
      auVar7._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
      auVar7._24_8_ = uStack_3c8;
      auVar10 = vpsllw_avx2(auVar7,ZEXT416(in_ECX));
      auVar9._16_8_ = uStack_410;
      auVar9._0_16_ = auVar17;
      auVar9._24_8_ = uStack_408;
      auVar10 = vpand_avx2(auVar10,auVar9);
      local_6e0 = vpsrlw_avx2(auVar10,ZEXT416(1));
      in_stack_fffffffffffffb3a = (ushort)local_674;
    }
    auVar7 = vpmovzxbw_avx2(local_700);
    auVar8 = vpmovzxbw_avx2(local_710);
    auVar11 = vpsubw_avx2(auVar8,auVar7);
    auVar10 = vpsllw_avx2(auVar7,ZEXT416(5));
    local_600._0_8_ = auVar10._0_8_;
    in_stack_fffffffffffffb00 = (__m128i *)local_600._0_8_;
    local_600._8_8_ = auVar10._8_8_;
    in_stack_fffffffffffffb08 = (__m128i *)local_600._8_8_;
    palStack_5f0 = auVar10._16_8_;
    in_stack_fffffffffffffb10 = palStack_5f0;
    palStack_5e8 = auVar10._24_8_;
    in_stack_fffffffffffffb18 = palStack_5e8;
    auVar12._16_8_ = palStack_450;
    auVar12._0_16_ = auVar3;
    auVar12._24_8_ = palStack_448;
    auVar6 = vpaddw_avx2(auVar10,auVar12);
    auVar9 = vpmullw_avx2(auVar11,local_6e0);
    local_600._0_8_ = auVar6._0_8_;
    local_600._8_8_ = auVar6._8_8_;
    palStack_5f0 = auVar6._16_8_;
    palStack_5e8 = auVar6._24_8_;
    local_6a0._0_8_ = auVar9._0_8_;
    local_6a0._8_8_ = auVar9._8_8_;
    local_6a0._16_8_ = auVar9._16_8_;
    local_6a0._24_8_ = auVar9._24_8_;
    auVar10 = vpaddw_avx2(auVar6,auVar9);
    auVar10 = vpsrlw_avx2(auVar10,ZEXT416(5));
    auVar13._16_16_ = ZEXT416(5);
    auVar13._0_16_ = auVar10._16_16_;
    auVar10 = vpackuswb_avx2(auVar10,auVar13);
    local_6c0._0_8_ = auVar10._0_8_;
    local_6c0._8_8_ = auVar10._8_8_;
    auVar4 = vpblendvb_avx(auVar2,auVar10._0_16_,*(undefined1 (*) [16])BaseMask[local_718]);
    *(undefined1 (*) [16])(local_870 + (long)local_678 * 2) = auVar4;
    local_674 = in_R8D + local_674;
    local_678 = local_678 + 1;
    local_6f0 = (__m128i *)local_6c0._0_8_;
    uStack_6e8 = local_6c0._8_8_;
    local_640 = auVar11;
    local_5e0 = auVar8;
    local_5c0 = auVar7;
    local_560 = local_6a0._0_8_;
    uStack_558 = local_6a0._8_8_;
    uStack_550 = local_6a0._16_8_;
    in_stack_fffffffffffffab8 = (__m128i *)local_6a0._24_8_;
    in_stack_fffffffffffffac0 = (__m128i *)local_600._0_8_;
    in_stack_fffffffffffffac8 = (__m128i *)local_600._8_8_;
    in_stack_fffffffffffffad0 = palStack_5f0;
    in_stack_fffffffffffffad8 = palStack_5e8;
    in_stack_fffffffffffffae0 = local_460;
    in_stack_fffffffffffffae8 = palStack_458;
    in_stack_fffffffffffffaf0 = palStack_450;
    in_stack_fffffffffffffaf8 = palStack_448;
    in_stack_fffffffffffffb40 = (__m128i *)local_6c0._0_8_;
  }
  for (local_71c = local_678; local_71c < 0x10; local_71c = local_71c + 1) {
    local_870[(long)local_71c * 2] = local_a0;
    local_870[(long)local_71c * 2 + 1] = uStack_98;
  }
LAB_005d1e30:
  local_760 = in_RSI;
  local_758 = in_RDI;
  local_588 = iVar14;
  local_584 = 6 - in_ECX;
  local_570 = local_870;
  local_660 = auVar17;
  auStack_650 = auVar18;
  for (local_8f4 = 4; local_8f4 < 8; local_8f4 = local_8f4 + 1) {
    local_750 = 0;
    uStack_748 = 0;
    local_8f0[(long)local_8f4 * 2] = 0;
    local_8f0[(long)local_8f4 * 2 + 1] = 0;
  }
  transpose16x8_8x16_sse2
            ((__m128i *)alStack_810,in_stack_fffffffffffff698,in_stack_fffffffffffff690,&alStack_880
             ,(__m128i *)(local_8b0 + 4),(__m128i *)(local_8b0 + 2),in_stack_fffffffffffffab8,
             in_stack_fffffffffffffac0,in_stack_fffffffffffffac8,in_stack_fffffffffffffad0,
             in_stack_fffffffffffffad8,in_stack_fffffffffffffae0,in_stack_fffffffffffffae8,
             in_stack_fffffffffffffaf0,in_stack_fffffffffffffaf8,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffb08,in_stack_fffffffffffffb10,in_stack_fffffffffffffb18,
             in_stack_fffffffffffffb20,in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,
             (__m128i *)
             CONCAT26(uVar21,CONCAT24(uVar20,CONCAT22(in_stack_fffffffffffffb3a,
                                                      in_stack_fffffffffffffb38))),
             in_stack_fffffffffffffb40);
  for (local_8f8 = 0; local_8f8 < 4; local_8f8 = local_8f8 + 1) {
    local_728 = (undefined8 *)(local_758 + local_8f8 * local_760);
    uStack_738 = local_8f0[(long)local_8f8 * 2 + 1];
    local_740 = local_8f0[(long)local_8f8 * 2];
    *local_728 = local_8f0[(long)local_8f8 * 2];
    local_728[1] = uStack_738;
  }
  return;
}

Assistant:

static void dr_prediction_z3_16x4_avx2(uint8_t *dst, ptrdiff_t stride,
                                       const uint8_t *left, int upsample_left,
                                       int dy) {
  __m128i dstvec[16], d[8];

  dr_prediction_z1_HxW_internal_avx2(4, 16, dstvec, left, upsample_left, dy);
  for (int i = 4; i < 8; i++) {
    d[i] = _mm_setzero_si128();
  }
  transpose16x8_8x16_sse2(
      &dstvec[0], &dstvec[1], &dstvec[2], &dstvec[3], &dstvec[4], &dstvec[5],
      &dstvec[6], &dstvec[7], &dstvec[8], &dstvec[9], &dstvec[10], &dstvec[11],
      &dstvec[12], &dstvec[13], &dstvec[14], &dstvec[15], &d[0], &d[1], &d[2],
      &d[3], &d[4], &d[5], &d[6], &d[7]);

  for (int i = 0; i < 4; i++) {
    _mm_storeu_si128((__m128i *)(dst + i * stride), d[i]);
  }
}